

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::CountVerticesAndFaces
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          uint *piFaces,uint *piVertices)

{
  aiMesh *pcMesh;
  uint uVar1;
  uint i;
  ulong uVar2;
  PretransformVertices *this_00;
  
  this_00 = this;
  for (uVar2 = 0; uVar2 < pcNode->mNumMeshes; uVar2 = uVar2 + 1) {
    pcMesh = pcScene->mMeshes[pcNode->mMeshes[uVar2]];
    if (pcMesh->mMaterialIndex == iMat) {
      uVar1 = GetMeshVFormat(this_00,pcMesh);
      if (uVar1 == iVFormat) {
        *piVertices = *piVertices + pcMesh->mNumVertices;
        *piFaces = *piFaces + pcMesh->mNumFaces;
      }
    }
  }
  for (uVar2 = 0; uVar2 < pcNode->mNumChildren; uVar2 = uVar2 + 1) {
    CountVerticesAndFaces(this,pcScene,pcNode->mChildren[uVar2],iMat,iVFormat,piFaces,piVertices);
  }
  return;
}

Assistant:

void PretransformVertices::CountVerticesAndFaces(const aiScene *pcScene, const aiNode *pcNode, unsigned int iMat,
		unsigned int iVFormat, unsigned int *piFaces, unsigned int *piVertices) const {
	for (unsigned int i = 0; i < pcNode->mNumMeshes; ++i) {
		aiMesh *pcMesh = pcScene->mMeshes[pcNode->mMeshes[i]];
		if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh)) {
			*piVertices += pcMesh->mNumVertices;
			*piFaces += pcMesh->mNumFaces;
		}
	}
	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		CountVerticesAndFaces(pcScene, pcNode->mChildren[i], iMat,
				iVFormat, piFaces, piVertices);
	}
}